

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<float>::RepeatedField
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  float *pfVar1;
  void **ppvVar2;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->total_size_ == 0) {
    ppvVar2 = &other->arena_or_elements_;
  }
  else {
    pfVar1 = elements(other);
    ppvVar2 = (void **)(pfVar1 + -2);
  }
  if (*ppvVar2 == (void *)0x0) {
    InternalSwap(this,other);
  }
  else if (other != this) {
    this->current_size_ = 0;
    MergeFrom(this,other);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(RepeatedField&& other) noexcept
    : RepeatedField() {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArena()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
}